

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O3

double incircleexact(double *pa,double *pb,double *pc,double *pd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double temp8 [8];
  double dab [12];
  double cda [12];
  double abc [12];
  double det24x [24];
  double det24y [24];
  double bcd [12];
  double det48x [48];
  double cdet [96];
  double bdet [96];
  double adet [96];
  double det48y [48];
  double ddet [96];
  double deter [384];
  double cddet [192];
  double abdet [192];
  double local_2c78;
  double local_2c68;
  double local_2c58;
  double local_2c48;
  double dStack_2bc0;
  double dStack_2b70;
  double dStack_2b60;
  undefined8 local_2b38;
  undefined8 uStack_2b30;
  double local_2b28;
  double local_2b20;
  undefined8 local_2b18;
  undefined8 uStack_2b10;
  double local_2b08;
  double local_2b00;
  undefined1 local_2af8 [16];
  double local_2ae8;
  double local_2ae0;
  double local_2ad8;
  double dStack_2ad0;
  double local_2ac8;
  double local_2ac0;
  double local_2ab8;
  double dStack_2ab0;
  double local_2aa8;
  double local_2aa0;
  double local_2a98 [8];
  double local_2a58;
  double dStack_2a50;
  double local_2a48;
  double local_2a40;
  double local_2a38 [12];
  double local_29d8 [12];
  double local_2978 [12];
  double local_2918 [24];
  double local_2858 [24];
  double local_2798 [12];
  double local_2738 [48];
  double local_25b8 [96];
  double local_22b8 [96];
  double local_1fb8 [96];
  double local_1cb8 [48];
  double local_1b38 [95];
  double adStack_1840 [385];
  double local_c38 [192];
  double local_638 [193];
  
  dVar4 = *pb;
  dVar5 = pb[1];
  auVar8 = *(undefined1 (*) [16])pb;
  dVar26 = *pa;
  dVar35 = pa[1];
  auVar9 = *(undefined1 (*) [16])pa;
  dVar23 = dVar5 * dVar26;
  dVar20 = dVar4 * dVar35;
  dVar22 = splitter * dVar5 - (splitter * dVar5 - dVar5);
  dVar27 = splitter * dVar4 - (splitter * dVar4 - dVar4);
  dVar38 = dVar5 - dVar22;
  dVar40 = dVar4 - dVar27;
  dVar32 = splitter * dVar26 - (splitter * dVar26 - dVar26);
  dVar34 = splitter * dVar35 - (splitter * dVar35 - dVar35);
  dVar46 = dVar26 - dVar32;
  dVar48 = dVar35 - dVar34;
  dVar29 = dVar38 * dVar46 - (((dVar23 - dVar32 * dVar22) - dVar46 * dVar22) - dVar38 * dVar32);
  dVar31 = dVar40 * dVar48 - (((dVar20 - dVar27 * dVar34) - dVar40 * dVar34) - dVar48 * dVar27);
  dVar33 = dVar29 - dVar31;
  dVar18 = dVar23 + dVar33;
  dVar23 = (dVar23 - (dVar18 - (dVar18 - dVar23))) + (dVar33 - (dVar18 - dVar23));
  dVar24 = dVar23 - dVar20;
  dVar32 = -dVar32;
  dVar27 = -dVar27;
  local_2ab8 = (dVar29 - (dVar33 + (dVar29 - dVar33))) + ((dVar29 - dVar33) - dVar31);
  dStack_2ab0 = (dVar23 - (dVar24 + (dVar23 - dVar24))) + ((dVar23 - dVar24) - dVar20);
  local_2aa0 = dVar18 + dVar24;
  local_2aa8 = (dVar18 - (local_2aa0 - (local_2aa0 - dVar18))) + (dVar24 - (local_2aa0 - dVar18));
  dVar33 = *pc;
  dVar30 = pc[1];
  auVar10 = *(undefined1 (*) [16])pc;
  dVar25 = splitter * dVar33 - (splitter * dVar33 - dVar33);
  dVar28 = splitter * dVar30 - (splitter * dVar30 - dVar30);
  dVar37 = *pd;
  dVar36 = pd[1];
  auVar11 = *(undefined1 (*) [16])pd;
  dVar42 = splitter * dVar36 - (splitter * dVar36 - dVar36);
  dVar43 = splitter * dVar37 - (splitter * dVar37 - dVar37);
  dVar19 = -dVar25;
  dVar21 = -dVar43;
  auVar1._8_4_ = SUB84(dVar43,0);
  auVar1._0_8_ = dVar32;
  auVar1._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar23 = dVar33 - dVar25;
  dVar24 = dVar30 - dVar28;
  auVar2._8_4_ = SUB84(dVar19,0);
  auVar2._0_8_ = dVar32;
  auVar2._12_4_ = (int)((ulong)dVar19 >> 0x20);
  dVar20 = dVar36 - dVar42;
  dVar29 = dVar37 - dVar43;
  dVar44 = -dVar40;
  auVar3._8_4_ = SUB84(dVar29,0);
  auVar3._0_8_ = dVar44;
  auVar3._12_4_ = (int)((ulong)-dVar29 >> 0x20);
  dVar18 = dVar5 * dVar33;
  dVar31 = dVar4 * dVar30;
  dVar39 = dVar38 * dVar23 - (dVar19 * dVar38 + -dVar23 * dVar22 + dVar19 * dVar22 + dVar18);
  dVar41 = dVar40 * dVar24 - (dVar24 * dVar27 + dVar28 * dVar44 + dVar28 * dVar27 + dVar31);
  dVar47 = dVar41 - dVar39;
  dVar45 = dVar31 + dVar47;
  dVar31 = (dVar31 - (dVar45 - (dVar45 - dVar31))) + (dVar47 - (dVar45 - dVar31));
  dVar19 = dVar31 - dVar18;
  dVar18 = (dVar31 - ((dVar31 - dVar19) + dVar19)) + ((dVar31 - dVar19) - dVar18);
  local_2af8._8_4_ = SUB84(dVar18,0);
  local_2af8._0_8_ = (dVar41 - (dVar47 + (dVar41 - dVar47))) + ((dVar41 - dVar47) - dVar39);
  local_2af8._12_4_ = (int)((ulong)dVar18 >> 0x20);
  local_2ae0 = dVar45 + dVar19;
  local_2ae8 = (dVar45 - (local_2ae0 - (local_2ae0 - dVar45))) + (dVar19 - (local_2ae0 - dVar45));
  dVar18 = dVar33 * dVar36;
  dVar31 = dVar30 * dVar37;
  dVar41 = dVar23 * dVar20 - (((dVar18 - dVar25 * dVar42) - dVar42 * dVar23) - dVar20 * dVar25);
  dVar43 = dVar24 * dVar29 - (((dVar31 - dVar43 * dVar28) - dVar28 * dVar29) - dVar24 * dVar43);
  dVar39 = dVar41 - dVar43;
  dVar25 = dVar18 + dVar39;
  dVar18 = (dVar18 - (dVar25 - (dVar25 - dVar18))) + (dVar39 - (dVar25 - dVar18));
  dVar19 = dVar18 - dVar31;
  local_2ad8 = (dVar41 - (dVar39 + (dVar41 - dVar39))) + ((dVar41 - dVar39) - dVar43);
  dStack_2ad0 = (dVar18 - (dVar19 + (dVar18 - dVar19))) + ((dVar18 - dVar19) - dVar31);
  local_2ac0 = dVar25 + dVar19;
  local_2ac8 = (dVar25 - (local_2ac0 - (local_2ac0 - dVar25))) + (dVar19 - (local_2ac0 - dVar25));
  dStack_2b60 = auVar1._8_8_;
  dVar18 = dVar26 * dVar36;
  dVar31 = dVar35 * dVar37;
  dVar41 = dVar46 * dVar20 - (dVar20 * dVar32 + -dVar46 * dVar42 + dVar32 * dVar42 + dVar18);
  dVar43 = dVar48 * dVar29 -
           (dVar48 * dStack_2b60 + -dVar29 * dVar34 + dStack_2b60 * dVar34 + dVar31);
  dVar25 = dVar43 - dVar41;
  dVar39 = dVar31 + dVar25;
  dVar31 = (dVar31 - (dVar39 - (dVar39 - dVar31))) + (dVar25 - (dVar39 - dVar31));
  dVar19 = dVar31 - dVar18;
  local_2a58 = (dVar43 - (dVar25 + (dVar43 - dVar25))) + ((dVar43 - dVar25) - dVar41);
  dStack_2a50 = (dVar31 - ((dVar31 - dVar19) + dVar19)) + ((dVar31 - dVar19) - dVar18);
  local_2a40 = dVar39 + dVar19;
  local_2a48 = (dVar39 - (local_2a40 - (local_2a40 - dVar39))) + (dVar19 - (local_2a40 - dVar39));
  dStack_2b70 = auVar2._8_8_;
  dVar30 = dVar30 * dVar26;
  dVar33 = dVar33 * dVar35;
  dVar24 = dVar24 * dVar46 - (dVar24 * dVar32 + -dVar46 * dVar28 + dVar32 * dVar28 + dVar30);
  dVar31 = dVar23 * dVar48 -
           (dVar48 * dStack_2b70 + -dVar23 * dVar34 + dStack_2b70 * dVar34 + dVar33);
  dVar35 = dVar24 - dVar31;
  dVar26 = dVar30 + dVar35;
  dVar23 = (dVar30 - (dVar26 - (dVar26 - dVar30))) + (dVar35 - (dVar26 - dVar30));
  dVar18 = dVar23 - dVar33;
  local_2b18 = (dVar24 - (dVar35 + (dVar24 - dVar35))) + ((dVar24 - dVar35) - dVar31);
  uStack_2b10 = (dVar23 - (dVar18 + (dVar23 - dVar18))) + ((dVar23 - dVar18) - dVar33);
  local_2b00 = dVar26 + dVar18;
  local_2b08 = (dVar26 - (local_2b00 - (local_2b00 - dVar26))) + (dVar18 - (local_2b00 - dVar26));
  dVar36 = dVar36 * dVar4;
  dVar37 = dVar37 * dVar5;
  dStack_2bc0 = auVar3._8_8_;
  dVar31 = dVar40 * dVar20 - (dVar20 * dVar27 + dVar44 * dVar42 + dVar27 * dVar42 + dVar36);
  dVar29 = dVar38 * dVar29 - (dVar38 * dVar21 + dStack_2bc0 * dVar22 + dVar21 * dVar22 + dVar37);
  dVar24 = dVar31 - dVar29;
  dVar23 = dVar36 + dVar24;
  dVar20 = (dVar36 - (dVar23 - (dVar23 - dVar36))) + (dVar24 - (dVar23 - dVar36));
  dVar18 = dVar20 - dVar37;
  local_2b38 = (dVar31 - (dVar24 + (dVar31 - dVar24))) + ((dVar31 - dVar24) - dVar29);
  uStack_2b30 = (dVar20 - (dVar18 + (dVar20 - dVar18))) + ((dVar20 - dVar18) - dVar37);
  local_2b20 = dVar23 + dVar18;
  local_2b28 = (dVar23 - (local_2b20 - (local_2b20 - dVar23))) + (dVar18 - (local_2b20 - dVar23));
  iVar12 = fast_expansion_sum_zeroelim(4,&local_2ad8,4,&local_2a58,local_2a98);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,local_2a98,4,(double *)&local_2b18,local_29d8);
  iVar13 = fast_expansion_sum_zeroelim(4,&local_2a58,4,&local_2ab8,local_2a98);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,local_2a98,4,(double *)&local_2b38,local_2a38);
  lVar17 = 0;
  do {
    uVar7 = *(uint *)((long)&local_2b38 + lVar17 * 8 + 4);
    uVar6 = (&uStack_2b30)[lVar17];
    *(undefined4 *)(&local_2b38 + lVar17) = *(undefined4 *)(&local_2b38 + lVar17);
    *(uint *)((long)&local_2b38 + lVar17 * 8 + 4) = uVar7 ^ 0x80000000;
    *(int *)(&uStack_2b30 + lVar17) = (int)uVar6;
    *(uint *)((long)&uStack_2b30 + lVar17 * 8 + 4) = (uint)((ulong)uVar6 >> 0x20) ^ 0x80000000;
    uVar7 = *(uint *)((long)&local_2b18 + lVar17 * 8 + 4);
    uVar6 = (&uStack_2b10)[lVar17];
    *(undefined4 *)(&local_2b18 + lVar17) = *(undefined4 *)(&local_2b18 + lVar17);
    *(uint *)((long)&local_2b18 + lVar17 * 8 + 4) = uVar7 ^ 0x80000000;
    *(int *)(&uStack_2b10 + lVar17) = (int)uVar6;
    *(uint *)((long)&uStack_2b10 + lVar17 * 8 + 4) = (uint)((ulong)uVar6 >> 0x20) ^ 0x80000000;
    lVar17 = lVar17 + 2;
  } while (lVar17 != 4);
  iVar14 = fast_expansion_sum_zeroelim(4,&local_2ab8,4,(double *)local_2af8,local_2a98);
  iVar14 = fast_expansion_sum_zeroelim(iVar14,local_2a98,4,(double *)&local_2b18,local_2978);
  iVar15 = fast_expansion_sum_zeroelim(4,(double *)local_2af8,4,&local_2ad8,local_2a98);
  iVar15 = fast_expansion_sum_zeroelim(iVar15,local_2a98,4,(double *)&local_2b38,local_2798);
  local_2c68 = auVar9._0_8_;
  iVar16 = scale_expansion_zeroelim(iVar15,local_2798,local_2c68,local_2918);
  iVar16 = scale_expansion_zeroelim(iVar16,local_2918,local_2c68,local_2738);
  dVar23 = auVar9._8_8_;
  iVar15 = scale_expansion_zeroelim(iVar15,local_2798,dVar23,local_2858);
  iVar15 = scale_expansion_zeroelim(iVar15,local_2858,dVar23,local_1cb8);
  iVar15 = fast_expansion_sum_zeroelim(iVar16,local_2738,iVar15,local_1cb8,local_1fb8);
  local_2c58 = auVar8._0_8_;
  iVar16 = scale_expansion_zeroelim(iVar12,local_29d8,local_2c58,local_2918);
  iVar16 = scale_expansion_zeroelim(iVar16,local_2918,-local_2c58,local_2738);
  dVar23 = auVar8._8_8_;
  iVar12 = scale_expansion_zeroelim(iVar12,local_29d8,dVar23,local_2858);
  iVar12 = scale_expansion_zeroelim(iVar12,local_2858,-dVar23,local_1cb8);
  iVar12 = fast_expansion_sum_zeroelim(iVar16,local_2738,iVar12,local_1cb8,local_22b8);
  local_2c78 = auVar10._0_8_;
  iVar16 = scale_expansion_zeroelim(iVar13,local_2a38,local_2c78,local_2918);
  iVar16 = scale_expansion_zeroelim(iVar16,local_2918,local_2c78,local_2738);
  dVar23 = auVar10._8_8_;
  iVar13 = scale_expansion_zeroelim(iVar13,local_2a38,dVar23,local_2858);
  iVar13 = scale_expansion_zeroelim(iVar13,local_2858,dVar23,local_1cb8);
  iVar13 = fast_expansion_sum_zeroelim(iVar16,local_2738,iVar13,local_1cb8,local_25b8);
  local_2c48 = auVar11._0_8_;
  iVar16 = scale_expansion_zeroelim(iVar14,local_2978,local_2c48,local_2918);
  iVar16 = scale_expansion_zeroelim(iVar16,local_2918,-local_2c48,local_2738);
  dVar23 = auVar11._8_8_;
  iVar14 = scale_expansion_zeroelim(iVar14,local_2978,dVar23,local_2858);
  iVar14 = scale_expansion_zeroelim(iVar14,local_2858,-dVar23,local_1cb8);
  iVar14 = fast_expansion_sum_zeroelim(iVar16,local_2738,iVar14,local_1cb8,local_1b38);
  iVar12 = fast_expansion_sum_zeroelim(iVar15,local_1fb8,iVar12,local_22b8,local_638);
  iVar13 = fast_expansion_sum_zeroelim(iVar13,local_25b8,iVar14,local_1b38,local_c38);
  iVar12 = fast_expansion_sum_zeroelim(iVar12,local_638,iVar13,local_c38,adStack_1840 + 1);
  return adStack_1840[iVar12];
}

Assistant:

REAL incircleexact(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  INEXACT REAL axby1, bxcy1, cxdy1, dxay1, axcy1, bxdy1;
  INEXACT REAL bxay1, cxby1, dxcy1, axdy1, cxay1, dxby1;
  REAL axby0, bxcy0, cxdy0, dxay0, axcy0, bxdy0;
  REAL bxay0, cxby0, dxcy0, axdy0, cxay0, dxby0;
  REAL ab[4], bc[4], cd[4], da[4], ac[4], bd[4];
  REAL temp8[8];
  int templen;
  REAL abc[12], bcd[12], cda[12], dab[12];
  int abclen, bcdlen, cdalen, dablen;
  REAL det24x[24], det24y[24], det48x[48], det48y[48];
  int xlen, ylen;
  REAL adet[96], bdet[96], cdet[96], ddet[96];
  int alen, blen, clen, dlen;
  REAL abdet[192], cddet[192];
  int ablen, cdlen;
  REAL deter[384];
  int deterlen;
  int i;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(axby1, axby0, bxay1, bxay0, ab[3], ab[2], ab[1], ab[0]);

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(bxcy1, bxcy0, cxby1, cxby0, bc[3], bc[2], bc[1], bc[0]);

  Two_Product(pc[0], pd[1], cxdy1, cxdy0);
  Two_Product(pd[0], pc[1], dxcy1, dxcy0);
  Two_Two_Diff(cxdy1, cxdy0, dxcy1, dxcy0, cd[3], cd[2], cd[1], cd[0]);

  Two_Product(pd[0], pa[1], dxay1, dxay0);
  Two_Product(pa[0], pd[1], axdy1, axdy0);
  Two_Two_Diff(dxay1, dxay0, axdy1, axdy0, da[3], da[2], da[1], da[0]);

  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Two_Diff(axcy1, axcy0, cxay1, cxay0, ac[3], ac[2], ac[1], ac[0]);

  Two_Product(pb[0], pd[1], bxdy1, bxdy0);
  Two_Product(pd[0], pb[1], dxby1, dxby0);
  Two_Two_Diff(bxdy1, bxdy0, dxby1, dxby0, bd[3], bd[2], bd[1], bd[0]);

  templen = fast_expansion_sum_zeroelim(4, cd, 4, da, temp8);
  cdalen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, cda);
  templen = fast_expansion_sum_zeroelim(4, da, 4, ab, temp8);
  dablen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, dab);
  for (i = 0; i < 4; i++) {
    bd[i] = -bd[i];
    ac[i] = -ac[i];
  }
  templen = fast_expansion_sum_zeroelim(4, ab, 4, bc, temp8);
  abclen = fast_expansion_sum_zeroelim(templen, temp8, 4, ac, abc);
  templen = fast_expansion_sum_zeroelim(4, bc, 4, cd, temp8);
  bcdlen = fast_expansion_sum_zeroelim(templen, temp8, 4, bd, bcd);

  xlen = scale_expansion_zeroelim(bcdlen, bcd, pa[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pa[0], det48x);
  ylen = scale_expansion_zeroelim(bcdlen, bcd, pa[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pa[1], det48y);
  alen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, adet);

  xlen = scale_expansion_zeroelim(cdalen, cda, pb[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pb[0], det48x);
  ylen = scale_expansion_zeroelim(cdalen, cda, pb[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pb[1], det48y);
  blen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, bdet);

  xlen = scale_expansion_zeroelim(dablen, dab, pc[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, pc[0], det48x);
  ylen = scale_expansion_zeroelim(dablen, dab, pc[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, pc[1], det48y);
  clen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, cdet);

  xlen = scale_expansion_zeroelim(abclen, abc, pd[0], det24x);
  xlen = scale_expansion_zeroelim(xlen, det24x, -pd[0], det48x);
  ylen = scale_expansion_zeroelim(abclen, abc, pd[1], det24y);
  ylen = scale_expansion_zeroelim(ylen, det24y, -pd[1], det48y);
  dlen = fast_expansion_sum_zeroelim(xlen, det48x, ylen, det48y, ddet);

  ablen = fast_expansion_sum_zeroelim(alen, adet, blen, bdet, abdet);
  cdlen = fast_expansion_sum_zeroelim(clen, cdet, dlen, ddet, cddet);
  deterlen = fast_expansion_sum_zeroelim(ablen, abdet, cdlen, cddet, deter);

  return deter[deterlen - 1];
}